

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  ImGuiDebugLogFlags *flags;
  float fVar1;
  uint uVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  char *line_end;
  char *pcVar7;
  long lVar8;
  ImGuiListClipper clipper;
  
  pIVar5 = GImGui;
  uVar2 = (GImGui->NextWindowData).Flags;
  if ((uVar2 & 2) == 0) {
    fVar1 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar2 | 2;
    (pIVar5->NextWindowData).SizeVal.x = 0.0;
    (pIVar5->NextWindowData).SizeVal.y = fVar1 * 12.0;
    (pIVar5->NextWindowData).SizeCond = 4;
  }
  bVar6 = Begin("Dear ImGui Debug Log",p_open,0);
  if ((bVar6) &&
     (pIVar4 = GImGui->CurrentWindow, pIVar4->WriteAccessed = true, pIVar4->BeginCount < 2)) {
    flags = &pIVar5->DebugLogFlags;
    CheckboxFlags("All",flags,0x7f);
    SetItemTooltip("(except InputRouting which is spammy)");
    ShowDebugLogFlag("ActiveId",1);
    ShowDebugLogFlag("Clipper",0x10);
    ShowDebugLogFlag("Focus",2);
    ShowDebugLogFlag("IO",0x40);
    ShowDebugLogFlag("Nav",8);
    ShowDebugLogFlag("Popup",4);
    ShowDebugLogFlag("Selection",0x20);
    ShowDebugLogFlag("InputRouting",0x80);
    bVar6 = SmallButton("Clear");
    if (bVar6) {
      ImVector<char>::clear(&(pIVar5->DebugLogBuf).Buf);
      ImGuiTextIndex::clear(&pIVar5->DebugLogIndex);
    }
    SameLine(0.0,-1.0);
    bVar6 = SmallButton("Copy");
    if (bVar6) {
      pcVar7 = (pIVar5->DebugLogBuf).Buf.Data;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = ImGuiTextBuffer::EmptyString;
      }
      SetClipboardText(pcVar7);
    }
    SameLine(0.0,-1.0);
    bVar6 = SmallButton("Configure Outputs..");
    if (bVar6) {
      OpenPopup("Outputs",0);
    }
    bVar6 = BeginPopup("Outputs",0);
    if (bVar6) {
      CheckboxFlags("OutputToTTY",flags,0x100000);
      BeginDisabled(true);
      CheckboxFlags("OutputToTestEngine",flags,0x200000);
      EndDisabled();
      EndPopup();
    }
    clipper.Ctx = (ImGuiContext *)0x0;
    BeginChild("##log",(ImVec2 *)&clipper,1,0xc000);
    uVar2 = pIVar5->DebugLogFlags;
    pIVar5->DebugLogFlags = uVar2 & 0xffffffef;
    clipper.StartSeekOffsetY = 0.0;
    clipper.TempData = (void *)0x0;
    clipper.ItemsCount = 0;
    clipper.ItemsHeight = 0.0;
    clipper.StartPosY = 0.0;
    clipper._28_4_ = 0;
    clipper.Ctx = (ImGuiContext *)0x0;
    clipper.DisplayStart = 0;
    clipper.DisplayEnd = 0;
    ImGuiListClipper::Begin(&clipper,(pIVar5->DebugLogIndex).LineOffsets.Size,-1.0);
    while( true ) {
      bVar6 = ImGuiListClipper::Step(&clipper);
      if (!bVar6) break;
      for (lVar8 = (long)clipper.DisplayStart; lVar8 < clipper.DisplayEnd; lVar8 = lVar8 + 1) {
        pcVar7 = (pIVar5->DebugLogBuf).Buf.Data;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = ImGuiTextBuffer::EmptyString;
        }
        iVar3 = (pIVar5->DebugLogIndex).LineOffsets.Data[lVar8];
        line_end = ImGuiTextIndex::get_line_end(&pIVar5->DebugLogIndex,pcVar7,(int)lVar8);
        DebugTextUnformattedWithLocateItem(pcVar7 + iVar3,line_end);
      }
    }
    *flags = uVar2;
    if ((GImGui->CurrentWindow->ScrollMax).y <= (GImGui->CurrentWindow->Scroll).y) {
      SetScrollHereY(1.0);
    }
    EndChild();
    End();
    ImGuiListClipper::~ImGuiListClipper(&clipper);
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    ImGuiDebugLogFlags all_enable_flags = ImGuiDebugLogFlags_EventMask_ & ~ImGuiDebugLogFlags_EventInputRouting;
    CheckboxFlags("All", &g.DebugLogFlags, all_enable_flags);
    SetItemTooltip("(except InputRouting which is spammy)");

    ShowDebugLogFlag("ActiveId", ImGuiDebugLogFlags_EventActiveId);
    ShowDebugLogFlag("Clipper", ImGuiDebugLogFlags_EventClipper);
    ShowDebugLogFlag("Focus", ImGuiDebugLogFlags_EventFocus);
    ShowDebugLogFlag("IO", ImGuiDebugLogFlags_EventIO);
    ShowDebugLogFlag("Nav", ImGuiDebugLogFlags_EventNav);
    ShowDebugLogFlag("Popup", ImGuiDebugLogFlags_EventPopup);
    ShowDebugLogFlag("Selection", ImGuiDebugLogFlags_EventSelection);
    ShowDebugLogFlag("InputRouting", ImGuiDebugLogFlags_EventInputRouting);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    SameLine();
    if (SmallButton("Configure Outputs.."))
        OpenPopup("Outputs");
    if (BeginPopup("Outputs"))
    {
        CheckboxFlags("OutputToTTY", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTTY);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        BeginDisabled();
#endif
        CheckboxFlags("OutputToTestEngine", &g.DebugLogFlags, ImGuiDebugLogFlags_OutputToTestEngine);
#ifndef IMGUI_ENABLE_TEST_ENGINE
        EndDisabled();
#endif
        EndPopup();
    }

    BeginChild("##log", ImVec2(0.0f, 0.0f), ImGuiChildFlags_Border, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    const ImGuiDebugLogFlags backup_log_flags = g.DebugLogFlags;
    g.DebugLogFlags &= ~ImGuiDebugLogFlags_EventClipper;

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
            DebugTextUnformattedWithLocateItem(g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no), g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no));
    g.DebugLogFlags = backup_log_flags;
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}